

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

AnonymousProgramSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::AnonymousProgramSymbol,slang::ast::Compilation&,slang::SourceLocation>
          (BumpAllocator *this,Compilation *args,SourceLocation *args_1)

{
  AnonymousProgramSymbol *this_00;
  
  this_00 = (AnonymousProgramSymbol *)allocate(this,0x78,8);
  ast::AnonymousProgramSymbol::AnonymousProgramSymbol(this_00,args,*args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }